

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_packsize(lua_State *L)

{
  KOption KVar1;
  ulong totalsize;
  ulong uVar2;
  uint ntoalign;
  char *fmt;
  size_t local_48;
  Header h;
  
  totalsize = 0;
  fmt = luaL_checklstring(L,1,(size_t *)0x0);
  h.islittle = 1;
  h.maxalign = 1;
  h.L = L;
  while (*fmt != '\0') {
    KVar1 = getdetails(&h,totalsize,&fmt,&local_48,&ntoalign);
    if (0xfffffffd < KVar1 - Kpadding) {
      luaL_argerror(L,1,"variable-length format");
    }
    uVar2 = ntoalign + local_48;
    if ((uVar2 ^ 0x7fffffffffffffff) < totalsize) {
      luaL_argerror(L,1,"format result too large");
    }
    totalsize = totalsize + uVar2;
  }
  lua_pushinteger(L,totalsize);
  return 1;
}

Assistant:

static int str_packsize (lua_State *L) {
  Header h;
  const char *fmt = luaL_checkstring(L, 1);  /* format string */
  size_t totalsize = 0;  /* accumulate total size of result */
  initheader(L, &h);
  while (*fmt != '\0') {
    unsigned ntoalign;
    size_t size;
    KOption opt = getdetails(&h, totalsize, &fmt, &size, &ntoalign);
    luaL_argcheck(L, opt != Kstring && opt != Kzstr, 1,
                     "variable-length format");
    size += ntoalign;  /* total space used by option */
    luaL_argcheck(L, totalsize <= LUA_MAXINTEGER - size,
                     1, "format result too large");
    totalsize += size;
  }
  lua_pushinteger(L, cast_st2S(totalsize));
  return 1;
}